

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void update_ampm(EOPLL *opll)

{
  int iVar1;
  EOPLL *opll_local;
  
  if ((opll->test_flag & 2) == 0) {
    iVar1 = 1;
    if ((opll->test_flag & 8) != 0) {
      iVar1 = 0x400;
    }
    opll->pm_phase = iVar1 + opll->pm_phase;
    iVar1 = 1;
    if ((opll->test_flag & 8) != 0) {
      iVar1 = 0x40;
    }
    opll->am_phase = iVar1 + opll->am_phase;
  }
  else {
    opll->pm_phase = 0;
    opll->am_phase = 0;
  }
  opll->lfo_am = am_table[(ulong)(long)(opll->am_phase >> 6) % 0xd2];
  return;
}

Assistant:

static void update_ampm(EOPLL *opll) {
  if (opll->test_flag & 2) {
    opll->pm_phase = 0;
    opll->am_phase = 0;
  } else {
    opll->pm_phase += (opll->test_flag & 8) ? 1024 : 1;
    opll->am_phase += (opll->test_flag & 8) ? 64 : 1;
  }
  opll->lfo_am = am_table[(opll->am_phase >> 6) % sizeof(am_table)];
}